

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O0

void __thiscall Fl_Window::free_icons(Fl_Window *this)

{
  long *plVar1;
  int local_14;
  int i;
  Fl_Window *this_local;
  
  *(undefined8 *)this->icon_ = 0;
  if (*(long *)(this->icon_ + 8) != 0) {
    for (local_14 = 0; local_14 < *(int *)(this->icon_ + 0x10); local_14 = local_14 + 1) {
      plVar1 = *(long **)(*(long *)(this->icon_ + 8) + (long)local_14 * 8);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    if (*(void **)(this->icon_ + 8) != (void *)0x0) {
      operator_delete__(*(void **)(this->icon_ + 8));
    }
    *(undefined8 *)(this->icon_ + 8) = 0;
  }
  *(undefined4 *)(this->icon_ + 0x10) = 0;
  return;
}

Assistant:

void Fl_Window::free_icons() {
  int i;

  icon_->legacy_icon = 0L;

  if (icon_->icons) {
    for (i = 0;i < icon_->count;i++)
      delete icon_->icons[i];
    delete [] icon_->icons;
    icon_->icons = 0L;
  }

  icon_->count = 0;

#ifdef WIN32
  if (icon_->big_icon)
    DestroyIcon(icon_->big_icon);
  if (icon_->small_icon)
    DestroyIcon(icon_->small_icon);

  icon_->big_icon = NULL;
  icon_->small_icon = NULL;
#endif
}